

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::SharedDtor
          (DictionaryValue_KeyValuePair *this)

{
  ulong uVar1;
  Value *pVVar2;
  undefined8 *puVar3;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  if (puVar3 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
               ,0x2139);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  if (this != (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    pVVar2 = this->key_;
    if (pVVar2 != (Value *)0x0) {
      Value::~Value(pVVar2);
    }
    operator_delete(pVVar2,0x30);
    pVVar2 = this->value_;
    if (pVVar2 != (Value *)0x0) {
      Value::~Value(pVVar2);
    }
    operator_delete(pVVar2,0x30);
  }
  return;
}

Assistant:

inline void DictionaryValue_KeyValuePair::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete key_;
  if (this != internal_default_instance()) delete value_;
}